

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O1

int BN_lshift(BIGNUM *r,BIGNUM *a,int n)

{
  uint uVar1;
  ulong *puVar2;
  ulong *__s;
  sbyte sVar3;
  BIGNUM *pBVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  iVar9 = 0;
  if (-1 < n) {
    r->neg = a->neg;
    uVar8 = (uint)n >> 6;
    pBVar4 = bn_wexpand((BIGNUM *)r,uVar8 + a->top + 1);
    iVar9 = 0;
    if (pBVar4 != (BIGNUM *)0x0) {
      puVar2 = a->d;
      __s = r->d;
      uVar1 = a->top;
      uVar5 = (ulong)uVar1;
      __s[(int)(uVar1 + uVar8)] = 0;
      if ((n & 0x3fU) == 0) {
        if (0 < (int)uVar1) {
          lVar6 = uVar5 + 1;
          do {
            __s[(ulong)uVar8 + lVar6 + -2] = puVar2[lVar6 + -2];
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
      }
      else if (0 < (int)uVar1) {
        sVar3 = (sbyte)(n & 0x3fU);
        uVar7 = __s[uVar8 + uVar5];
        lVar6 = uVar5 + 1;
        do {
          uVar5 = puVar2[lVar6 + -2];
          __s[(ulong)uVar8 + lVar6 + -1] = uVar5 >> (0x40U - sVar3 & 0x3f) | uVar7;
          uVar7 = uVar5 << sVar3;
          __s[(ulong)uVar8 + lVar6 + -2] = uVar7;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      memset(__s,0,(ulong)(uVar8 * 8));
      r->top = a->top + uVar8 + 1;
      bn_correct_top((BIGNUM *)r);
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int BN_lshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_LSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    r->neg = a->neg;
    nw = n / BN_BITS2;
    if (bn_wexpand(r, a->top + nw + 1) == NULL)
        return (0);
    lb = n % BN_BITS2;
    rb = BN_BITS2 - lb;
    f = a->d;
    t = r->d;
    t[a->top + nw] = 0;
    if (lb == 0)
        for (i = a->top - 1; i >= 0; i--)
            t[nw + i] = f[i];
    else
        for (i = a->top - 1; i >= 0; i--) {
            l = f[i];
            t[nw + i + 1] |= (l >> rb) & BN_MASK2;
            t[nw + i] = (l << lb) & BN_MASK2;
        }
    memset(t, 0, sizeof(*t) * nw);
    r->top = a->top + nw + 1;
    bn_correct_top(r);
    bn_check_top(r);
    return (1);
}